

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O1

bool __thiscall CommandOptions::set_video_ref(CommandOptions *this,string *arg)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ref_tokens;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,",","");
  Kumu::km_token_split((string *)&local_60,(string *)arg);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_60._M_impl._M_node._M_size == 1) {
LAB_00112add:
    lVar1 = strtol((char *)local_60._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,
                   (char **)0x0,10);
    lVar2 = -lVar1;
    if (0 < lVar1) {
      lVar2 = lVar1;
    }
    this->cdci_WhiteRefLevel = (uint)lVar2;
    if ((((uint)lVar2 < 0x10000) && (this->cdci_BlackRefLevel < 0x10000)) &&
       (bVar3 = true, this->cdci_ColorRange < 0x10000)) goto LAB_00112b25;
    set_video_ref();
  }
  else {
    if (local_60._M_impl._M_node._M_size == 2) {
LAB_00112aa8:
      lVar1 = strtol((char *)local_60._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,
                     (char **)0x0,10);
      lVar2 = -lVar1;
      if (0 < lVar1) {
        lVar2 = lVar1;
      }
      this->cdci_BlackRefLevel = (ui32_t)lVar2;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60,(iterator)local_60._M_impl._M_node.super__List_node_base._M_prev);
      goto LAB_00112add;
    }
    if (local_60._M_impl._M_node._M_size == 3) {
      lVar1 = strtol((char *)local_60._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,
                     (char **)0x0,10);
      lVar2 = -lVar1;
      if (0 < lVar1) {
        lVar2 = lVar1;
      }
      this->cdci_ColorRange = (ui32_t)lVar2;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60,(iterator)local_60._M_impl._M_node.super__List_node_base._M_prev);
      goto LAB_00112aa8;
    }
    set_video_ref();
  }
  bVar3 = false;
LAB_00112b25:
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_60);
  return bVar3;
}

Assistant:

bool set_video_ref(const std::string& arg)
  {
    std::list<std::string> ref_tokens = Kumu::km_token_split(arg, ",");

    switch ( ref_tokens.size() )
      {
      case 3:
	cdci_ColorRange = Kumu::xabs(strtol(ref_tokens.back().c_str(), 0, 10));
	ref_tokens.pop_back();
      case 2:
	cdci_BlackRefLevel = Kumu::xabs(strtol(ref_tokens.back().c_str(), 0, 10));
	ref_tokens.pop_back();
      case 1:
	cdci_WhiteRefLevel = Kumu::xabs(strtol(ref_tokens.back().c_str(), 0, 10));
	break;

      default:
	fprintf(stderr, "Expecting <white-ref>[,<black-ref>[,<color-range>]]\n");
	return false;
      }

    if ( cdci_WhiteRefLevel > 65535 || cdci_BlackRefLevel > 65535 || cdci_ColorRange > 65535 )
      {
	fprintf(stderr, "Unexpected CDCI video referece levels.\n");
	return false;
      }

    return true;
  }